

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

bool __thiscall
Lib::DHMap<Kernel::VarSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
DomainIteratorCore::hasNext(DomainIteratorCore *this)

{
  bool bVar1;
  long in_RDI;
  
  bVar1 = DHMap<Kernel::VarSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
          IteratorBase::hasNext((IteratorBase *)(in_RDI + 0x10));
  return bVar1;
}

Assistant:

inline bool hasNext() { return _base.hasNext(); }